

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_serial_impl_deserialize.c
# Opt level: O3

int metacall_serial_impl_deserialize_float(value *v,char *src,size_t length)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  ushort **ppuVar4;
  value pvVar5;
  size_t sVar6;
  uint uVar7;
  double dVar8;
  
  if (length != 0) {
    ppuVar4 = __ctype_b_loc();
    bVar2 = false;
    sVar6 = 0;
    do {
      bVar1 = src[sVar6];
      bVar3 = bVar2;
      if (((*ppuVar4)[(char)bVar1] >> 0xb & 1) == 0) {
        uVar7 = bVar1 - 0x2b;
        if (0x3b < uVar7) {
          return 1;
        }
        if ((0x800000004000005U >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
          if ((ulong)uVar7 != 3) {
            return 1;
          }
LAB_00102dcd:
          bVar3 = true;
          if (bVar2) {
            return 1;
          }
        }
      }
      else if (bVar1 == 0x2e) goto LAB_00102dcd;
      bVar2 = bVar3;
      sVar6 = sVar6 + 1;
    } while (length != sVar6);
  }
  dVar8 = atof(src);
  pvVar5 = (value)value_create_float((float)dVar8);
  *v = pvVar5;
  return (uint)(pvVar5 == (value)0x0);
}

Assistant:

int metacall_serial_impl_deserialize_float(value *v, const char *src, size_t length)
{
	size_t iterator, is_digit;

	/* TODO: Improve parser */
	for (is_digit = 0, iterator = 0; iterator < length; ++iterator)
	{
		if (isdigit((int)src[iterator]) == 0 &&
			src[iterator] != '.' &&
			src[iterator] != '-' &&
			src[iterator] != '+' &&
			src[iterator] != 'E' &&
			src[iterator] != 'f')
		{
			return 1;
		}

		if (src[iterator] == '.')
		{
			if (is_digit == 1)
			{
				return 1;
			}

			is_digit = 1;
		}
	}

	/* TODO: Warning possible information lost in casting */
	*v = value_create_float((float)atof(src));

	return (*v == NULL);
}